

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sais.c
# Opt level: O0

int sais_int_bwt(int *T,int *U,int *A,int n,int k)

{
  int local_34;
  int pidx;
  int i;
  int k_local;
  int n_local;
  int *A_local;
  int *U_local;
  int *T_local;
  
  if ((((T == (int *)0x0) || (U == (int *)0x0)) || (A == (int *)0x0)) || ((n < 0 || (k < 1)))) {
    T_local._4_4_ = -1;
  }
  else if (n < 2) {
    T_local._4_4_ = n;
    if (n == 1) {
      *U = *T;
    }
  }
  else {
    T_local._4_4_ = sais_main(T,A,(int *)0x0,0,n,k,4,1,1);
    if (-1 < T_local._4_4_) {
      *U = T[n + -1];
      for (local_34 = 0; local_34 < T_local._4_4_; local_34 = local_34 + 1) {
        U[local_34 + 1] = A[local_34];
      }
      while (local_34 = local_34 + 1, local_34 < n) {
        U[local_34] = A[local_34];
      }
      T_local._4_4_ = T_local._4_4_ + 1;
    }
  }
  return T_local._4_4_;
}

Assistant:

int
sais_int_bwt(const int *T, int *U, int *A, int n, int k) {
  int i, pidx;
  if((T == NULL) || (U == NULL) || (A == NULL) || (n < 0) || (k <= 0)) { return -1; }
  if(n <= 1) { if(n == 1) { U[0] = T[0]; } return n; }
  pidx = sais_main(T, A, NULL, 0, n, k, sizeof(int), 1,1);
  if(pidx < 0) { return pidx; }
  U[0] = T[n - 1];
  for(i = 0; i < pidx; ++i) { U[i + 1] = A[i]; }
  for(i += 1; i < n; ++i) { U[i] = A[i]; }
  pidx += 1;
  return pidx;
}